

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<void(S::*const&)()>::operator!=
          (result *__return_storage_ptr__,expression_lhs<void(S::*const&)()> *this,
          offset_in_S_to_subr *rhs)

{
  lest *this_00;
  offset_in_S_to_subr oVar1;
  offset_in_S_to_subr oVar2;
  offset_in_S_to_subr *in_R8;
  allocator<char> local_81;
  offset_in_S_to_subr local_80;
  offset_in_S_to_subr local_78;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  oVar1 = *(offset_in_S_to_subr *)this_00;
  local_78 = *(offset_in_S_to_subr *)(this_00 + 8);
  oVar2 = *rhs;
  local_80 = rhs[1];
  std::__cxx11::string::string<std::allocator<char>>(local_50,"!=",&local_81);
  to_string<void(S::*)(),void(S::*)()>
            (&local_70,this_00,(offset_in_S_to_subr *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = local_78 != local_80 && oVar1 != 0 || oVar1 != oVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result{ lhs >  rhs, to_string( lhs, ">" , rhs ) }; }